

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

QString * __thiscall
QCommonStylePrivate::toolButtonElideText
          (QCommonStylePrivate *this,QStyleOptionToolButton *option,QRect *textRect,int flags)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFont *unaff_retaddr;
  QTextOption *in_stack_00000008;
  QString *in_stack_00000010;
  QCommonStylePrivate *in_stack_00000018;
  QTextOption textOption;
  QString text;
  Alignment in_stack_00000114;
  TextElideMode in_stack_00002ac8;
  int in_stack_00002ad0;
  QPointF *in_stack_00002ae0;
  undefined4 in_stack_ffffffffffffff38;
  AlignmentFlag in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  QChar local_24;
  QChar local_22;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 lastVisibleLineShouldBeElided;
  QRect *textRect_00;
  
  textRect_00 = *(QRect **)(in_FS_OFFSET + 0x28);
  iVar1 = QFontMetrics::horizontalAdvance((QString *)(in_RDX + 0x20),(int)in_RDX + 0x60);
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (iVar2 < iVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    lastVisibleLineShouldBeElided = 0xaa;
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QChar::QChar<char16_t,_true>(&local_22,L'\n');
    QChar::QChar<QChar::SpecialCharacter,_true>(&local_24,LineSeparator);
    QString::replace((QChar *)&local_20,(QChar *)(ulong)(ushort)local_22.ucs,
                     (uint)(ushort)local_24.ucs);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = 0xffffffffffffffff;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QTextOption::QTextOption((QTextOption *)&local_40);
    QTextOption::setWrapMode((QTextOption *)&local_40,ManualWrap);
    QTextOption::setTextDirection((QTextOption *)&local_40,*(LayoutDirection *)(in_RDX + 0xc));
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    calculateElidedText(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                        textRect_00,in_stack_00000114,in_stack_00002ac8,in_stack_00002ad0,
                        (bool)lastVisibleLineShouldBeElided,in_stack_00002ae0);
    QTextOption::~QTextOption((QTextOption *)&local_40);
    QString::~QString((QString *)0x3c4de7);
  }
  else {
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  if (*(QRect **)(in_FS_OFFSET + 0x28) == textRect_00) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommonStylePrivate::toolButtonElideText(const QStyleOptionToolButton *option,
                                                 const QRect &textRect, int flags) const
{
    if (option->fontMetrics.horizontalAdvance(option->text) <= textRect.width())
        return option->text;

    QString text = option->text;
    text.replace(u'\n', QChar::LineSeparator);
    QTextOption textOption;
    textOption.setWrapMode(QTextOption::ManualWrap);
    textOption.setTextDirection(option->direction);

    return calculateElidedText(text, textOption,
                               option->font, textRect, Qt::AlignTop,
                               Qt::ElideMiddle, flags,
                               false, nullptr);
}